

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O0

void __thiscall ADynamicLight::PostBeginPlay(ADynamicLight *this)

{
  subsector_t *psVar1;
  DVector3 local_38;
  TVector2<double> local_20;
  ADynamicLight *local_10;
  ADynamicLight *this_local;
  
  local_10 = this;
  AActor::PostBeginPlay(&this->super_AActor);
  if (((this->super_AActor).SpawnFlags & 0x10) == 0) {
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0xd])(this,0);
  }
  AActor::Pos(&local_38,&this->super_AActor);
  TVector2<double>::TVector2(&local_20,&local_38);
  psVar1 = R_PointInSubsector(&local_20);
  this->subsector = psVar1;
  return;
}

Assistant:

void ADynamicLight::PostBeginPlay()
{
	Super::PostBeginPlay();
	
	if (!(SpawnFlags & MTF_DORMANT))
	{
		Activate (NULL);
	}

	subsector = R_PointInSubsector(Pos());
}